

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_reader.cpp
# Opt level: O0

void __thiscall
charls::jpeg_stream_reader::try_read_spiff_header_segment
          (jpeg_stream_reader *this,spiff_header *header,bool *spiff_header_found)

{
  bool bVar1;
  byte bVar2;
  uint32_t uVar3;
  size_t sVar4;
  const_iterator __first1;
  const_iterator __last1;
  iterator __first2;
  undefined1 local_8c [43];
  byte local_61;
  undefined1 local_60 [7];
  uint8_t high_version;
  const_byte_span local_38;
  array<unsigned_char,_6UL> local_26;
  bool *pbStack_20;
  array<unsigned_char,_6UL> spiff_tag;
  bool *spiff_header_found_local;
  spiff_header *header_local;
  jpeg_stream_reader *this_local;
  
  pbStack_20 = spiff_header_found;
  sVar4 = const_byte_span::size(&this->segment_data_);
  if (0x1d < sVar4) {
    builtin_memcpy(local_26._M_elems,"SPIFF",6);
    __first1 = std::array<unsigned_char,_6UL>::cbegin(&local_26);
    __last1 = std::array<unsigned_char,_6UL>::cend(&local_26);
    local_38 = read_bytes(this,6);
    __first2 = const_byte_span::begin(&local_38);
    bVar1 = std::equal<unsigned_char_const*,unsigned_char_const*>(__first1,__last1,__first2);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_61 = read_byte(this);
      if (local_61 < 3) {
        skip_byte(this);
        bVar2 = read_byte(this);
        header->profile_id = (uint)bVar2;
        bVar2 = read_uint8(this);
        header->component_count = (uint)bVar2;
        uVar3 = read_uint32(this);
        header->height = uVar3;
        uVar3 = read_uint32(this);
        header->width = uVar3;
        bVar2 = read_byte(this);
        header->color_space = (uint)bVar2;
        bVar2 = read_uint8(this);
        header->bits_per_sample = (uint)bVar2;
        bVar2 = read_byte(this);
        header->compression_type = (uint)bVar2;
        bVar2 = read_byte(this);
        header->resolution_units = (uint)bVar2;
        uVar3 = read_uint32(this);
        header->vertical_resolution = uVar3;
        uVar3 = read_uint32(this);
        header->horizontal_resolution = uVar3;
        *pbStack_20 = true;
      }
      else {
        memset(local_8c,0,0x28);
        memcpy(header,local_8c,0x28);
        *pbStack_20 = false;
      }
    }
    else {
      memset(local_60,0,0x28);
      memcpy(header,local_60,0x28);
      *pbStack_20 = false;
    }
    return;
  }
  __assert_fail("segment_data_.size() >= 30",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpeg_stream_reader.cpp"
                ,0x2ba,
                "void charls::jpeg_stream_reader::try_read_spiff_header_segment(spiff_header &, bool &)"
               );
}

Assistant:

USE_DECL_ANNOTATIONS void jpeg_stream_reader::try_read_spiff_header_segment(spiff_header& header, bool& spiff_header_found)
{
    ASSERT(segment_data_.size() >= 30);

    const array<uint8_t, 6> spiff_tag{'S', 'P', 'I', 'F', 'F', 0};
    if (!equal(spiff_tag.cbegin(), spiff_tag.cend(), read_bytes(6).begin()))
    {
        header = {};
        spiff_header_found = false;
        return;
    }

    const auto high_version{read_byte()};
    if (high_version > spiff_major_revision_number)
    {
        header = {};
        spiff_header_found = false;
        return; // Treat unknown versions as if the SPIFF header doesn't exists.
    }
    skip_byte(); // low version

    header.profile_id = static_cast<spiff_profile_id>(read_byte());
    header.component_count = read_uint8();
    header.height = read_uint32();
    header.width = read_uint32();
    header.color_space = static_cast<spiff_color_space>(read_byte());
    header.bits_per_sample = read_uint8();
    header.compression_type = static_cast<spiff_compression_type>(read_byte());
    header.resolution_units = static_cast<spiff_resolution_units>(read_byte());
    header.vertical_resolution = read_uint32();
    header.horizontal_resolution = read_uint32();

    spiff_header_found = true;
}